

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O0

void save_keypress_history(keypress *kp)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  keycode_t k;
  keypress *kp_local;
  
  if (*borg_cfg != 0) {
    if (kp->type == EVT_KBRD) {
      uVar1 = kp->code;
      if ((uVar1 < 0x20) || (0x7e < uVar1)) {
        if (uVar1 == 0x9c) {
          pcVar2 = format("& Key <Enter> (0x%02lX)",0x9c);
          borg_note(pcVar2);
        }
        else if (uVar1 == 0xe000) {
          pcVar2 = format("& Key <Esc> (0x%02lX)",0xe000);
          borg_note(pcVar2);
        }
        else {
          pcVar2 = format("& Key <0x%02lX>",(ulong)uVar1);
          borg_note(pcVar2);
        }
      }
      else {
        pcVar2 = format("& Key <%c> (0x%02lX)",(ulong)(uint)(int)(char)uVar1,(ulong)uVar1);
        borg_note(pcVar2);
      }
    }
    else {
      pcVar2 = format("& non-Keyboard <0x%02X>",(ulong)kp->type);
      borg_note(pcVar2);
    }
  }
  borg_key_history[borg_key_history_head].code = kp->code;
  lVar3 = (long)borg_key_history_head;
  borg_key_history_head = borg_key_history_head + 1;
  borg_key_history[lVar3].type = kp->type;
  if (borg_key_history_head == 0x2000) {
    memcpy(borg_key_history,borg_key_history + 0x1f9b,0x4b0);
    borg_key_history_head = 100;
  }
  return;
}

Assistant:

void save_keypress_history(struct keypress *kp)
{
    /* Note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (kp->type == EVT_KBRD) {
            keycode_t k = kp->code;
            if (k >= 32 && k <= 126) {
                borg_note(format("& Key <%c> (0x%02lX)", (char)k, (unsigned long)k));
            } else {
                if (k == KC_ENTER)
                    borg_note(format("& Key <Enter> (0x%02lX)", (unsigned long)k));
                else if (k == ESCAPE)
                    borg_note(format("& Key <Esc> (0x%02lX)", (unsigned long)k));
                else
                    borg_note(format("& Key <0x%02lX>", (unsigned long)k));
            }
        } else {
            borg_note(format("& non-Keyboard <0x%02X>", kp->type));
        }

    }

    /* Store the char, advance the queue */
    borg_key_history[borg_key_history_head].code = kp->code;
    borg_key_history[borg_key_history_head++].type = kp->type;

    /* on full array, keep the last 100 */
    if (borg_key_history_head == KEY_SIZE) {
        memcpy(borg_key_history, &borg_key_history[KEY_SIZE - 101], sizeof(struct keypress) * 100);
        borg_key_history_head = 100;
    }
}